

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O2

void duckdb_je_prof_tctx_try_destroy(tsd_t *tsd,prof_tctx_t *tctx)

{
  undefined8 *puVar1;
  byte *pbVar2;
  prof_tdata_t *tdata_00;
  prof_gctx_t *ppVar3;
  ulong uVar4;
  prof_tctx_t *ppVar5;
  void *pvVar6;
  undefined1 *puVar7;
  _Bool _Var8;
  int iVar9;
  ulong *puVar10;
  long lVar11;
  prof_tctx_t *ppVar12;
  prof_tctx_t *ppVar13;
  ulong uVar14;
  uintptr_t key;
  _Bool even_if_attached;
  _Bool even_if_attached_00;
  undefined8 *puVar15;
  long *plVar16;
  malloc_mutex_t *pmVar17;
  prof_tctx_t *ppVar18;
  base_t *key_00;
  base_t *pbVar19;
  ulong uVar20;
  prof_tdata_t *tdata;
  base_t *pbVar21;
  rtree_t *prVar22;
  rtree_metadata_t rVar23;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_850;
  base_t *local_838;
  
  tdata_00 = tctx->tdata;
  if ((((duckdb_je_opt_prof_accum) || ((tctx->cnts).curobjs != 0)) || (tctx->prepared != false)) ||
     (tctx->recent_count != 0)) {
    pmVar17 = tdata_00->lock;
LAB_01e95c05:
    (pmVar17->field_0).field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar17->field_0 + 0x48));
    return;
  }
  ppVar3 = tctx->gctx;
  tctx->tdata = (prof_tdata_t *)0x0;
  key_00 = (base_t *)0x0;
  duckdb_je_ckh_remove(tsd,&tdata_00->bt2tctx,&ppVar3->bt,(void **)0x0,(void **)0x0);
  _Var8 = prof_tdata_should_destroy((tsdn_t *)tdata_00,(prof_tdata_t *)0x0,even_if_attached);
  pmVar17 = tdata_00->lock;
  (pmVar17->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar17->field_0 + 0x48));
  if (_Var8) {
    prof_tdata_destroy(tsd,tdata_00,even_if_attached_00);
  }
  malloc_mutex_lock((tsdn_t *)tsd,ppVar3->lock);
  if (tctx->state != prof_tctx_state_nominal) {
    tctx->state = prof_tctx_state_purgatory;
    pmVar17 = ppVar3->lock;
    goto LAB_01e95c05;
  }
  pbVar21 = (base_t *)(ppVar3->tctxs).rbt_root;
  puVar15 = (undefined8 *)&stack0xfffffffffffff7d8;
  local_838 = pbVar21;
  while (pbVar21 != (base_t *)0x0) {
    iVar9 = prof_tctx_comp(tctx,(prof_tctx_t *)pbVar21);
    *(int *)(puVar15 + -1) = iVar9;
    if (-1 < iVar9) {
      pbVar21 = (base_t *)(*(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) & 0xfffffffffffffffe);
      *puVar15 = pbVar21;
      if (iVar9 != 0) goto LAB_01e95cc4;
      *(undefined4 *)(puVar15 + -1) = 1;
      puVar10 = puVar15 + -2;
      while (pbVar21 != (base_t *)0x0) {
        *(undefined4 *)(puVar15 + 1) = 0xffffffff;
        pbVar21 = *(base_t **)((long)&(pbVar21->mtx).field_0 + 0x50);
        puVar15[2] = pbVar21;
        puVar15 = puVar15 + 2;
      }
      goto LAB_01e95ce3;
    }
    pbVar21 = *(base_t **)((long)&(pbVar21->mtx).field_0 + 0x50);
    *puVar15 = pbVar21;
LAB_01e95cc4:
    puVar15 = puVar15 + 2;
  }
  puVar15 = puVar15 + -2;
  puVar10 = (ulong *)0x0;
LAB_01e95ce3:
  puVar1 = puVar15 + -2;
  ppVar12 = (prof_tctx_t *)puVar15[-2];
  if (ppVar12 == tctx) {
    pbVar21 = (base_t *)(tctx->tctx_link).rbn_left;
    if (pbVar21 == (base_t *)0x0) {
      if ((base_t **)puVar1 == &stack0xfffffffffffff7c8) {
        (ppVar3->tctxs).rbt_root = (prof_tctx_t *)0x0;
        goto LAB_01e960d1;
      }
      goto LAB_01e95dd0;
    }
    puVar7 = (undefined1 *)((long)&(pbVar21->mtx).field_0 + 0x58);
    *puVar7 = *puVar7 & 0xfe;
    if ((base_t **)puVar1 != &stack0xfffffffffffff7c8) {
      if (*(int *)(puVar15 + -3) < 0) {
        lVar11 = puVar15[-4];
LAB_01e9605e:
        *(base_t **)(lVar11 + 0x70) = pbVar21;
      }
      else {
        lVar11 = puVar15[-4];
LAB_01e9604a:
        *(ulong *)(lVar11 + 0x78) =
             (ulong)((uint)*(undefined8 *)(lVar11 + 0x78) & 1) | (ulong)pbVar21;
      }
      goto LAB_01e960d1;
    }
  }
  else {
    ppVar18 = (ppVar12->tctx_link).rbn_right_red;
    key_00 = (base_t *)(ulong)((uint)(tctx->tctx_link).rbn_right_red & 1);
    (ppVar12->tctx_link).rbn_right_red =
         (prof_tctx_t *)((ulong)ppVar18 & 0xfffffffffffffffe | (ulong)key_00);
    (ppVar12->tctx_link).rbn_left = (tctx->tctx_link).rbn_left;
    (ppVar12->tctx_link).rbn_right_red =
         (prof_tctx_t *)
         ((ulong)(tctx->tctx_link).rbn_right_red & 0xfffffffffffffffe | (ulong)key_00);
    (tctx->tctx_link).rbn_right_red =
         (prof_tctx_t *)
         ((ulong)(tctx->tctx_link).rbn_right_red & 0xfffffffffffffffe | (ulong)((uint)ppVar18 & 1));
    *puVar10 = (ulong)ppVar12;
    *puVar1 = tctx;
    ppVar12 = tctx;
    if ((base_t **)puVar10 == &stack0xfffffffffffff7c8) {
      (ppVar3->tctxs).rbt_root = (prof_tctx_t *)*puVar10;
    }
    else if ((int)puVar10[-1] < 0) {
      *(ulong *)(puVar10[-2] + 0x70) = *puVar10;
    }
    else {
      *(ulong *)(puVar10[-2] + 0x78) =
           (ulong)((uint)*(undefined8 *)(puVar10[-2] + 0x78) & 1) | *puVar10;
    }
LAB_01e95dd0:
    if (((ulong)(ppVar12->tctx_link).rbn_right_red & 1) != 0) {
      *(undefined8 *)(puVar15[-4] + 0x70) = 0;
      goto LAB_01e960d1;
    }
    puVar15[-2] = 0;
    for (plVar16 = puVar15 + -6; puVar10 = (ulong *)(plVar16 + 2), pbVar21 = local_838,
        &stack0xfffffffffffff7c8 <= puVar10; plVar16 = plVar16 + -2) {
      key_00 = (base_t *)plVar16[4];
      if (-1 < (int)plVar16[3]) {
        uVar14 = *puVar10;
        pbVar21 = *(base_t **)(uVar14 + 0x70);
        uVar20 = (ulong)((uint)*(undefined8 *)(uVar14 + 0x78) & 1);
        *(ulong *)(uVar14 + 0x78) = uVar20 | (ulong)key_00;
        uVar4 = *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58);
        pbVar19 = pbVar21;
        if ((uVar4 & 1) == 0) {
          if (uVar20 == 0 && ((ulong)key_00 & 1) == 0) {
            key_00 = *(base_t **)((long)&(pbVar21->mtx).field_0 + 0x50);
            if ((key_00 == (base_t *)0x0) ||
               (uVar20 = *(ulong *)((long)&(key_00->mtx).field_0 + 0x58), (uVar20 & 1) == 0)) {
              *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) = uVar4 | 1;
              goto LAB_01e95e89;
            }
            *(ulong *)((long)&(key_00->mtx).field_0 + 0x58) = uVar20 & 0xfffffffffffffffe;
            uVar4 = *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58);
            key_00 = (base_t *)(uVar4 & 0xfffffffffffffffe);
            *(base_t **)(uVar14 + 0x70) = key_00;
            *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) = (uint)uVar4 & 1 | uVar14;
            goto LAB_01e96008;
          }
          lVar11 = *(long *)((long)&(pbVar21->mtx).field_0 + 0x50);
          if ((lVar11 == 0) || ((*(byte *)(lVar11 + 0x78) & 1) == 0)) {
            *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) = uVar4 | 1;
            *(byte *)(uVar14 + 0x78) = *(byte *)(uVar14 + 0x78) & 0xfe;
            goto LAB_01e960d1;
          }
          key_00 = (base_t *)((ulong)key_00 & 0xfffffffffffffffe);
          *(base_t **)(uVar14 + 0x78) = key_00;
          puVar7 = (undefined1 *)((long)&(pbVar21->mtx).field_0 + 0x58);
          *puVar7 = *puVar7 | 1;
          *(byte *)(lVar11 + 0x78) = *(byte *)(lVar11 + 0x78) & 0xfe;
          uVar4 = *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58);
          *(ulong *)(uVar14 + 0x70) = uVar4 & 0xfffffffffffffffe;
          *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) = (uint)uVar4 & 1 | uVar14;
        }
        else {
          key_00 = *(base_t **)((uVar4 & 0xfffffffffffffffe) + 0x70);
          if ((key_00 == (base_t *)0x0) ||
             (uVar20 = *(ulong *)((long)&(key_00->mtx).field_0 + 0x58), (uVar20 & 1) == 0)) {
            pbVar2 = (byte *)((uVar4 & 0xfffffffffffffffe) + 0x78);
            *pbVar2 = *pbVar2 | 1;
            *(ulong *)(uVar14 + 0x70) =
                 *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) & 0xfffffffffffffffe;
            *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) = uVar14 & 0xfffffffffffffffe;
          }
          else {
            *(ulong *)((long)&(key_00->mtx).field_0 + 0x58) = uVar20 & 0xfffffffffffffffe;
            uVar4 = *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58);
            pbVar19 = (base_t *)(uVar4 & 0xfffffffffffffffe);
            *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) = (uint)uVar4 & 1 | uVar14;
            uVar4 = *(ulong *)((long)&(pbVar19->mtx).field_0 + 0x58);
            *(ulong *)(uVar14 + 0x70) = uVar4 & 0xfffffffffffffffe;
            *(ulong *)((long)&(pbVar19->mtx).field_0 + 0x58) = (uint)uVar4 & 1 | uVar14;
            *(ulong *)((long)&(pbVar21->mtx).field_0 + 0x58) =
                 (ulong)((uint)*(undefined8 *)((long)&(pbVar21->mtx).field_0 + 0x58) & 1) |
                 *(ulong *)((long)&(pbVar19->mtx).field_0 + 0x50);
            *(base_t **)((long)&(pbVar19->mtx).field_0 + 0x50) = pbVar21;
            key_00 = pbVar19;
          }
LAB_01e96008:
          pbVar21 = pbVar19;
          if ((base_t **)puVar10 == &stack0xfffffffffffff7c8) break;
        }
        if ((int)plVar16[1] < 0) {
          lVar11 = *plVar16;
          goto LAB_01e9605e;
        }
        lVar11 = *plVar16;
        goto LAB_01e9604a;
      }
      ppVar12 = (prof_tctx_t *)*puVar10;
      (ppVar12->tctx_link).rbn_left = (prof_tctx_t *)key_00;
      ppVar18 = (ppVar12->tctx_link).rbn_right_red;
      if (((ulong)ppVar18 & 1) != 0) {
        ppVar18 = (prof_tctx_t *)((ulong)ppVar18 & 0xfffffffffffffffe);
        ppVar13 = (ppVar18->tctx_link).rbn_left;
        if ((ppVar13 == (prof_tctx_t *)0x0) ||
           (((ulong)(ppVar13->tctx_link).rbn_right_red & 1) == 0)) {
          ppVar13 = (prof_tctx_t *)((ulong)ppVar13 | 1);
        }
        else {
          (ppVar12->tctx_link).rbn_right_red = ppVar18;
          ppVar5 = (ppVar13->tctx_link).rbn_right_red;
          (ppVar18->tctx_link).rbn_left = (prof_tctx_t *)((ulong)ppVar5 & 0xfffffffffffffffe);
          (ppVar13->tctx_link).rbn_right_red =
               (prof_tctx_t *)((ulong)((uint)ppVar5 & 1) | (ulong)ppVar18);
          ppVar18 = (prof_tctx_t *)((ulong)ppVar13 & 0xfffffffffffffffe);
          ppVar13 = (prof_tctx_t *)
                    ((ulong)((*(uint *)&(ppVar12->tctx_link).rbn_right_red | (uint)ppVar13) & 1) |
                    (ulong)(ppVar18->tctx_link).rbn_left);
        }
        (ppVar12->tctx_link).rbn_right_red = ppVar13;
        (ppVar18->tctx_link).rbn_left = ppVar12;
        if ((int)plVar16[1] < 0) {
          *(prof_tctx_t **)(*plVar16 + 0x70) = ppVar18;
        }
        else {
          lVar11 = *plVar16;
          uVar14 = (ulong)((uint)*(undefined8 *)(lVar11 + 0x78) & 1) | (ulong)ppVar18;
LAB_01e960b6:
          *(ulong *)(lVar11 + 0x78) = uVar14;
        }
        goto LAB_01e960d1;
      }
      ppVar13 = (ppVar18->tctx_link).rbn_left;
      if ((ppVar13 != (prof_tctx_t *)0x0) &&
         (key_00 = (base_t *)(ppVar13->tctx_link).rbn_right_red, ((ulong)key_00 & 1) != 0)) {
        key_00 = (base_t *)((ulong)key_00 & 0xfffffffffffffffe);
        (ppVar18->tctx_link).rbn_left = (prof_tctx_t *)key_00;
        (ppVar13->tctx_link).rbn_right_red = ppVar18;
        ppVar18 = (prof_tctx_t *)((ulong)ppVar13 & 0xfffffffffffffffe);
        (ppVar12->tctx_link).rbn_right_red =
             (prof_tctx_t *)
             ((ulong)((*(uint *)&(ppVar12->tctx_link).rbn_right_red | (uint)ppVar13) & 1) |
             (ulong)(ppVar18->tctx_link).rbn_left);
        (ppVar18->tctx_link).rbn_left = ppVar12;
        if ((base_t **)puVar10 == &stack0xfffffffffffff7c8) {
          (ppVar3->tctxs).rbt_root = ppVar18;
        }
        else {
          lVar11 = *plVar16;
          if (-1 < (int)plVar16[1]) {
            uVar14 = (ulong)((uint)*(undefined8 *)(lVar11 + 0x78) & 1) | (ulong)ppVar18;
            goto LAB_01e960b6;
          }
          *(prof_tctx_t **)(lVar11 + 0x70) = ppVar18;
        }
        goto LAB_01e960d1;
      }
      (ppVar12->tctx_link).rbn_right_red = (prof_tctx_t *)((ulong)ppVar13 | 1);
      (ppVar18->tctx_link).rbn_left = ppVar12;
      *puVar10 = (ulong)ppVar18;
LAB_01e95e89:
    }
  }
  (ppVar3->tctxs).rbt_root = (prof_tctx_t *)pbVar21;
LAB_01e960d1:
  if (((duckdb_je_opt_prof_accum == false) && ((ppVar3->tctxs).rbt_root == (prof_tctx_t *)0x0)) &&
     (ppVar3->nlimbo == 0)) {
    ppVar3->nlimbo = 1;
  }
  pmVar17 = ppVar3->lock;
  (pmVar17->field_0).field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pmVar17->field_0 + 0x48));
  if (tsd == (tsd_t *)0x0) {
    prVar22 = (rtree_t *)&stack0xfffffffffffff7c8;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar22);
  }
  else {
    prVar22 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rtree_read(&local_850,(tsdn_t *)tsd,prVar22,(rtree_ctx_t *)tctx,(uintptr_t)key_00);
  key = (uintptr_t)((uint)(local_850.edata)->e_bits & 0xfff);
  pvVar6 = duckdb_je_arenas[key].repr;
  if (tsd == (tsd_t *)0x0) {
    prVar22 = (rtree_t *)&stack0xfffffffffffff7c8;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar22);
  }
  else {
    prVar22 = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rVar23 = rtree_metadata_read((tsdn_t *)tsd,prVar22,(rtree_ctx_t *)tctx,key);
  LOCK();
  plVar16 = (long *)((long)pvVar6 + 0x48);
  *plVar16 = *plVar16 - duckdb_je_sz_index2size_tab[rVar23.szind];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd,tctx);
  return;
}

Assistant:

void
prof_tctx_try_destroy(tsd_t *tsd, prof_tctx_t *tctx) {
	malloc_mutex_assert_owner(tsd_tsdn(tsd), tctx->tdata->lock);
	if (prof_tctx_should_destroy(tsd, tctx)) {
		/* tctx->tdata->lock will be released in prof_tctx_destroy(). */
		prof_tctx_destroy(tsd, tctx);
	} else {
		malloc_mutex_unlock(tsd_tsdn(tsd), tctx->tdata->lock);
	}
}